

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseXMLParser.cpp
# Opt level: O0

bool __thiscall
Rml::BaseXMLParser::FindString(BaseXMLParser *this,char *string,String *data,bool escape_brackets)

{
  bool bVar1;
  char *pcVar2;
  char *error_str;
  char c;
  char previous;
  bool in_string;
  bool in_brackets;
  char first_char;
  String *pSStack_28;
  bool escape_brackets_local;
  String *data_local;
  char *string_local;
  BaseXMLParser *this_local;
  
  error_str._6_1_ = *string;
  error_str._5_1_ = 0;
  error_str._4_1_ = 0;
  error_str._3_1_ = '\0';
  error_str._7_1_ = escape_brackets;
  pSStack_28 = data;
  data_local = (String *)string;
  string_local = (char *)this;
  while( true ) {
    bVar1 = AtEnd(this);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return false;
    }
    error_str._2_1_ = Look(this);
    if (error_str._2_1_ == '\n') {
      this->line_number = this->line_number + 1;
    }
    if (((error_str._7_1_ & 1) != 0) &&
       (pcVar2 = XMLParseTools::ParseDataBrackets
                           ((bool *)((long)&error_str + 5),(bool *)((long)&error_str + 4),
                            error_str._2_1_,error_str._3_1_), pcVar2 != (char *)0x0)) break;
    if (((error_str._2_1_ == error_str._6_1_) && ((error_str._5_1_ & 1) == 0)) &&
       (bVar1 = PeekString(this,(char *)data_local,true), bVar1)) {
      return true;
    }
    ::std::__cxx11::string::operator+=((string *)pSStack_28,error_str._2_1_);
    error_str._3_1_ = error_str._2_1_;
    Next(this);
  }
  Log::Message(LT_WARNING,"XML parse error. %s",pcVar2);
  return false;
}

Assistant:

bool BaseXMLParser::FindString(const char* string, String& data, bool escape_brackets)
{
	const char first_char = string[0];
	bool in_brackets = false;
	bool in_string = false;
	char previous = 0;

	while (!AtEnd())
	{
		const char c = Look();

		// Count line numbers
		if (c == '\n')
		{
			line_number++;
		}

		if (escape_brackets)
		{
			const char* error_str = XMLParseTools::ParseDataBrackets(in_brackets, in_string, c, previous);
			if (error_str)
			{
				Log::Message(Log::LT_WARNING, "XML parse error. %s", error_str);
				return false;
			}
		}

		if (c == first_char && !in_brackets && PeekString(string))
		{
			return true;
		}

		data += c;
		previous = c;
		Next();
	}

	return false;
}